

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::handleRankDeficiency(HEkk *this)

{
  uint uVar1;
  uint row_out;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = (this->simplex_nla_).factor_.rank_deficiency;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    lVar5 = (long)(this->simplex_nla_).factor_.row_with_no_pivot.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar7];
    lVar6 = (this->lp_).num_col_ + lVar5;
    uVar1 = (this->simplex_nla_).factor_.var_with_no_pivot.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar7];
    (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar6] = '\0';
    (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start[(int)uVar1] = '\x01';
    row_out = (this->simplex_nla_).factor_.row_with_no_pivot.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar7];
    iVar2 = (this->lp_).num_col_;
    pcVar4 = "logical";
    if ((int)uVar1 < iVar2) {
      pcVar4 = " column";
      iVar2 = 0;
    }
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "HEkk::handleRankDeficiency: %4d: Basic row of leaving variable (%4d is %s %4d) is %4d; Entering logical = %4d is variable %d)\n"
                ,uVar7 & 0xffffffff,(ulong)uVar1,pcVar4,(ulong)(uVar1 - iVar2),(ulong)row_out,lVar5,
                lVar6);
    addBadBasisChange(this,row_out,(HighsInt)lVar6,uVar1,kSingular,true);
  }
  (this->status_).has_ar_matrix = false;
  return;
}

Assistant:

void HEkk::handleRankDeficiency() {
  HFactor& factor = simplex_nla_.factor_;
  HighsInt rank_deficiency = factor.rank_deficiency;
  vector<HighsInt>& row_with_no_pivot = factor.row_with_no_pivot;
  vector<HighsInt>& var_with_no_pivot = factor.var_with_no_pivot;
  for (HighsInt k = 0; k < rank_deficiency; k++) {
    HighsInt row_in = row_with_no_pivot[k];
    HighsInt variable_in = lp_.num_col_ + row_in;
    HighsInt variable_out = var_with_no_pivot[k];
    basis_.nonbasicFlag_[variable_in] = kNonbasicFlagFalse;
    basis_.nonbasicFlag_[variable_out] = kNonbasicFlagTrue;
    HighsInt row_out = row_with_no_pivot[k];
    assert(basis_.basicIndex_[row_out] == variable_in);
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::handleRankDeficiency: %4d: Basic row of leaving variable (%4d "
        "is %s %4d) is "
        "%4d; Entering logical = %4d is variable %d)\n",
        (int)k, (int)variable_out,
        variable_out < lp_.num_col_ ? " column" : "logical",
        variable_out < lp_.num_col_ ? (int)variable_out
                                    : (int)(variable_out - lp_.num_col_),
        (int)row_out, (int)(row_in), (int)variable_in);
    // NB Parameters row_out, variable_in, variable_out, since
    // variable_in is the logical that must not come out to be
    // replaced by the structural variable_out
    addBadBasisChange(row_out, variable_in, variable_out,
                      BadBasisChangeReason::kSingular, true);
  }
  status_.has_ar_matrix = false;
}